

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_serial.c
# Opt level: O2

mm_serial_context_t * open_serial(char *modem_dev,FILE *logstream,FILE *bytestream)

{
  int iVar1;
  mm_serial_context_t *pmVar2;
  
  if (bytestream == (FILE *)0x0) {
    iVar1 = platform_open_serial(modem_dev);
  }
  else {
    iVar1 = -1;
  }
  pmVar2 = (mm_serial_context_t *)calloc(1,0x18);
  if (pmVar2 != (mm_serial_context_t *)0x0) {
    pmVar2->fd = iVar1;
    pmVar2->logstream = logstream;
    pmVar2->bytestream = bytestream;
    return pmVar2;
  }
  fprintf(_stderr,"%s: Error allocating memory.\n","open_serial");
  exit(-0xc);
}

Assistant:

mm_serial_context_t* open_serial(const char *modem_dev, FILE *logstream, FILE *bytestream) {
    int fd = -1;
    mm_serial_context_t *pserial_context;

    if (bytestream == NULL) {
        fd = platform_open_serial(modem_dev);
    }

    pserial_context = (mm_serial_context_t *)calloc(1, sizeof(mm_serial_context_t));

    if (pserial_context == NULL) {
        fprintf(stderr, "%s: Error allocating memory.\n", __func__);
        exit(-ENOMEM);
    }

    pserial_context->fd = fd;
    pserial_context->logstream  = logstream;
    pserial_context->bytestream = bytestream;

    return pserial_context;
}